

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

bool CoreML::hasCategoricalSequences(Model *model)

{
  int iVar1;
  Type *pTVar2;
  FeatureType *pFVar3;
  bool bVar4;
  int iVar5;
  ModelDescription *pMVar6;
  
  pMVar6 = model->description_;
  if (pMVar6 == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  iVar5 = (pMVar6->input_).super_RepeatedPtrFieldBase.current_size_;
  bVar4 = 0 < iVar5;
  if (0 < iVar5) {
    iVar5 = 0;
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(pMVar6->input_).super_RepeatedPtrFieldBase,iVar5);
      pFVar3 = pTVar2->type_;
      if (pFVar3 == (FeatureType *)0x0) {
        pFVar3 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      if ((pFVar3->_oneof_case_[0] == 7) &&
         ((((pFVar3->Type_).multiarraytype_)->datatype_ - 1U & 0xfffffffd) == 0)) {
        if (bVar4) {
          return true;
        }
        break;
      }
      pMVar6 = model->description_;
      if (pMVar6 == (ModelDescription *)0x0) {
        pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
      }
      iVar5 = iVar5 + 1;
      iVar1 = (pMVar6->input_).super_RepeatedPtrFieldBase.current_size_;
      bVar4 = iVar5 < iVar1;
    } while (iVar5 < iVar1);
  }
  pMVar6 = model->description_;
  if (pMVar6 == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  iVar5 = (pMVar6->output_).super_RepeatedPtrFieldBase.current_size_;
  bVar4 = 0 < iVar5;
  if (0 < iVar5) {
    iVar5 = 0;
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(pMVar6->output_).super_RepeatedPtrFieldBase,iVar5);
      pFVar3 = pTVar2->type_;
      if (pFVar3 == (FeatureType *)0x0) {
        pFVar3 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      if ((pFVar3->_oneof_case_[0] == 7) &&
         ((((pFVar3->Type_).multiarraytype_)->datatype_ - 1U & 0xfffffffd) == 0)) {
        return bVar4;
      }
      pMVar6 = model->description_;
      if (pMVar6 == (ModelDescription *)0x0) {
        pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
      }
      iVar5 = iVar5 + 1;
      iVar1 = (pMVar6->output_).super_RepeatedPtrFieldBase.current_size_;
      bVar4 = iVar5 < iVar1;
    } while (iVar5 < iVar1);
  }
  return bVar4;
}

Assistant:

bool CoreML::hasCategoricalSequences(const Specification::Model& model) {

    for (int i=0; i<model.description().input_size(); i++) {
        auto &feature = model.description().input(i);
        if (feature.type().Type_case() == Specification::FeatureType::kSequenceType) {
            switch (feature.type().sequencetype().Type_case()) {
                case Specification::SequenceFeatureType::kStringType:
                case Specification::SequenceFeatureType::kInt64Type:
                    return true;
                default:
                    break;
            }
        }
    }

    for (int i=0; i<model.description().output_size(); i++) {
        auto &feature = model.description().output(i);
        if (feature.type().Type_case() == Specification::FeatureType::kSequenceType) {
            switch (feature.type().sequencetype().Type_case()) {
                case Specification::SequenceFeatureType::kStringType:
                case Specification::SequenceFeatureType::kInt64Type:
                    return true;
                default:
                    break;
            }
        }
    }

    return false;
}